

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O0

Result __thiscall
PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
::Poll(PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
       *this)

{
  anon_enum_32 aVar1;
  PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
  *this_local;
  
  printf("\n");
  aVar1 = SCoro::
          SCoro<PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>::PrintPlus,_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>::PrintNewline>
          ::Poll(&this->nested_state);
  SCoro::Result::Result((Result *)((long)&this_local + 4),(bool)((aVar1 != End ^ 0xffU) & 1));
  return (Result)this_local._4_4_;
}

Assistant:

SCoro::Result Poll() noexcept
    {
        std::printf("\n");
        return !nested_state.Poll();
    }